

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

void __thiscall Character::AddChatLog(Character *this,string *marker,string *name,string *msg)

{
  int iVar1;
  _Map_pointer ppbVar2;
  _Elt_pointer pbVar3;
  _Elt_pointer pbVar4;
  _Elt_pointer pbVar5;
  _Elt_pointer pbVar6;
  World *pWVar7;
  pointer pcVar8;
  int iVar9;
  mapped_type *this_00;
  undefined8 *puVar10;
  long *plVar11;
  long *plVar12;
  size_type *psVar13;
  ulong uVar14;
  undefined8 uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  key_type local_e8;
  long *local_c8;
  undefined8 local_c0;
  long local_b8;
  undefined8 uStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98 [2];
  string local_88;
  string *local_68;
  string *local_60;
  string *local_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  ppbVar2 = (this->chat_log).
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  iVar1 = *(int *)&(this->chat_log).
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node;
  pbVar3 = (this->chat_log).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  pbVar4 = (this->chat_log).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pbVar5 = (this->chat_log).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
  pbVar6 = (this->chat_log).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pWVar7 = this->world;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_68 = msg;
  local_60 = name;
  local_58 = marker;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ReportChatLogSize","");
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar7->config,&local_e8);
  iVar9 = util::variant::GetInt(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (iVar9 <= (int)((int)((ulong)((long)pbVar3 - (long)pbVar6) >> 5) +
                     (int)((ulong)((long)pbVar4 - (long)pbVar5) >> 5) +
                    ((((uint)((int)ppbVar2 - iVar1) >> 3) - 1) +
                    (uint)(ppbVar2 == (_Map_pointer)0x0)) * 0x10)) {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&this->chat_log);
  }
  pcVar8 = (local_58->_M_dataplus)._M_p;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar8,pcVar8 + local_58->_M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  util::ucfirst(&local_88,local_60);
  uVar14 = 0xf;
  if (local_a8 != local_98) {
    uVar14 = local_98[0];
  }
  if (uVar14 < local_88._M_string_length + local_a0) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      uVar15 = local_88.field_2._M_allocated_capacity;
    }
    if (local_88._M_string_length + local_a0 <= (ulong)uVar15) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_a8);
      goto LAB_00116b58;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_88._M_dataplus._M_p);
LAB_00116b58:
  local_c8 = &local_b8;
  plVar11 = puVar10 + 2;
  if ((long *)*puVar10 == plVar11) {
    local_b8 = *plVar11;
    uStack_b0 = puVar10[3];
  }
  else {
    local_b8 = *plVar11;
    local_c8 = (long *)*puVar10;
  }
  local_c0 = puVar10[1];
  *puVar10 = plVar11;
  puVar10[1] = 0;
  *(undefined1 *)plVar11 = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_c8);
  plVar12 = plVar11 + 2;
  if ((long *)*plVar11 == plVar12) {
    local_40 = *plVar12;
    lStack_38 = plVar11[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar12;
    local_50 = (long *)*plVar11;
  }
  local_48 = plVar11[1];
  *plVar11 = (long)plVar12;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_50,(ulong)(local_68->_M_dataplus)._M_p);
  psVar13 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_e8.field_2._M_allocated_capacity = *psVar13;
    local_e8.field_2._8_8_ = plVar11[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar13;
    local_e8._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_e8._M_string_length = plVar11[1];
  *plVar11 = (long)psVar13;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->chat_log,
             &local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_c8 != &local_b8) {
    operator_delete(local_c8,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  return;
}

Assistant:

void Character::AddChatLog(std::string marker, std::string name, std::string msg)
{
	if (int(chat_log.size()) >= int(this->world->config["ReportChatLogSize"]))
		chat_log.pop_front();

	chat_log.push_back(marker + " " + util::ucfirst(name) + ": " + msg);
}